

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::crc_internal::CRC32::UnextendByZeroes(CRC32 *this,uint32_t *crc,size_t length)

{
  uint32_t uVar1;
  size_t length_local;
  uint32_t *crc_local;
  CRC32 *this_local;
  
  uVar1 = anon_unknown_0::ReverseBits(*crc);
  *crc = uVar1;
  ExtendByZeroesImpl(crc,length,this->reverse_zeroes_,this->reverse_table0_);
  uVar1 = anon_unknown_0::ReverseBits(*crc);
  *crc = uVar1;
  return;
}

Assistant:

void CRC32::UnextendByZeroes(uint32_t* crc, size_t length) const {
  // See the comment in CRC32::InitTables() for an explanation of the algorithm
  // below.
  *crc = ReverseBits(*crc);
  ExtendByZeroesImpl(crc, length, reverse_zeroes_, reverse_table0_);
  *crc = ReverseBits(*crc);
}